

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void compute_O_rc4_key(string *user_password,string *owner_password,EncryptionData *data,uchar *key)

{
  logic_error *this;
  int key_len;
  uchar *md;
  int iterations;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  size_type *in_R8;
  MD5 md5;
  string password;
  Digest digest;
  MD5 MStack_78;
  string *local_68;
  long local_60;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (*(int *)key < 5) {
    md = key;
    local_68 = (string *)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,owner_password,
               (long)&(owner_password->_M_dataplus)._M_p + (long)&data->V);
    n = extraout_RDX;
    if (local_60 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_68);
      n = extraout_RDX_00;
      owner_password = user_password;
    }
    MD5::MD5(&MStack_78,(uchar *)owner_password,n,md);
    pad_or_truncate_password_V4((string *)(local_58 + 0x10),local_68);
    MD5::encodeDataIncrementally(&MStack_78,(char *)local_58._16_8_,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._16_8_ != &local_38) {
      operator_delete((void *)local_58._16_8_,local_38._M_allocated_capacity + 1);
    }
    key_len = 0x10;
    if (*(int *)(key + 8) < 0x10) {
      key_len = *(int *)(key + 8);
    }
    iterations = 0x32;
    if (*(int *)(key + 4) < 3) {
      iterations = 0;
    }
    iterate_md5_digest(&MStack_78,(Digest *)(local_58 + 0x10),iterations,key_len);
    *in_R8 = local_58._16_8_;
    in_R8[1] = local_58._24_8_;
    if (MStack_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (MStack_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68 != (string *)local_58) {
      operator_delete(local_68,(ulong)(local_58._0_8_ + 1));
    }
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_O_rc4_key called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
compute_O_rc4_key(
    std::string const& user_password,
    std::string const& owner_password,
    QPDF::EncryptionData const& data,
    unsigned char key[OU_key_bytes_V4])
{
    if (data.getV() >= 5) {
        throw std::logic_error("compute_O_rc4_key called for file with V >= 5");
    }
    std::string password = owner_password;
    if (password.empty()) {
        password = user_password;
    }
    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    MD5::Digest digest;
    int key_len = std::min(QIntC::to_int(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    memcpy(key, digest, OU_key_bytes_V4);
}